

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

void xmlRegFreeState(xmlRegStatePtr state)

{
  if (state != (xmlRegStatePtr)0x0) {
    if (state->trans != (xmlRegTrans *)0x0) {
      (*xmlFree)(state->trans);
    }
    if (state->transTo != (int *)0x0) {
      (*xmlFree)(state->transTo);
    }
    (*xmlFree)(state);
    return;
  }
  return;
}

Assistant:

static void
xmlRegFreeState(xmlRegStatePtr state) {
    if (state == NULL)
	return;

    if (state->trans != NULL)
	xmlFree(state->trans);
    if (state->transTo != NULL)
	xmlFree(state->transTo);
    xmlFree(state);
}